

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.h
# Opt level: O0

Rational * __thiscall Rational::operator-(Rational *this)

{
  Rational *in_RDI;
  Rational *temp;
  BigInteger *in_stack_ffffffffffffff98;
  Rational *this_00;
  Rational *in_stack_ffffffffffffffb0;
  
  this_00 = in_RDI;
  Rational(in_stack_ffffffffffffffb0,in_RDI);
  BigInteger::operator-(&this_00->_numerator);
  BigInteger::operator=(&in_RDI->_numerator,in_stack_ffffffffffffff98);
  BigInteger::~BigInteger((BigInteger *)0x112799);
  return in_RDI;
}

Assistant:

const Rational operator-() const
    {
        Rational temp(*this);
        temp._numerator = -temp._numerator;
        return temp;
    }